

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O2

void __thiscall glu::ContextInfo::ContextInfo(ContextInfo *this,RenderContext *context)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int iVar1;
  uint uVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  char *__s;
  long lVar4;
  int ndx;
  ulong uVar5;
  long lVar6;
  allocator<char> local_91;
  ContextInfo *local_90;
  int numExtensions;
  undefined1 auStack_80 [24];
  _Base_ptr local_68;
  size_t local_60;
  string local_50 [32];
  
  this->_vptr_ContextInfo = (_func_int **)&PTR__ContextInfo_00c44630;
  this->m_context = context;
  this_00 = &this->m_extensions;
  (this->m_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_80._16_8_ = auStack_80;
  _numExtensions = (pointer)0x0;
  auStack_80._0_8_ = 0;
  auStack_80._8_8_ = (_Base_ptr)0x0;
  local_60 = 0;
  local_68 = (_Base_ptr)auStack_80._16_8_;
  CachedValue<std::set<int,_std::less<int>,_std::allocator<int>_>,_glu::GetCompressedTextureFormats>
  ::CachedValue(&this->m_compressedTextureFormats,&numExtensions);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &numExtensions);
  iVar1 = (*context->_vptr_RenderContext[3])(context);
  lVar6 = CONCAT44(extraout_var,iVar1);
  uVar2 = (*context->_vptr_RenderContext[2])(context);
  if ((uVar2 & 0x3ff) == 2) {
    local_90 = this;
    __s = (char *)(**(code **)(lVar6 + 0xa78))(0x1f03);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    checkError(dVar3,"glGetString(GL_EXTENSIONS) failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluContextInfo.cpp"
               ,0xc1);
    std::__cxx11::string::string<std::allocator<char>>(local_50,__s,&local_91);
    lVar6 = 0;
    while( true ) {
      lVar4 = std::__cxx11::string::find((char)local_50,0x20);
      if (lVar4 == -1) break;
      std::__cxx11::string::substr((ulong)&numExtensions,(ulong)local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numExtensions
                );
      std::__cxx11::string::~string((string *)&numExtensions);
      lVar6 = lVar4 + 1;
    }
    if (lVar6 != -1) {
      std::__cxx11::string::substr((ulong)&numExtensions,(ulong)local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numExtensions
                );
      std::__cxx11::string::~string((string *)&numExtensions);
    }
    std::__cxx11::string::~string(local_50);
  }
  else {
    _numExtensions = _numExtensions & 0xffffffff00000000;
    (**(code **)(lVar6 + 0x868))(0x821d);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    checkError(dVar3,"glGetIntegerv(GL_NUM_EXTENSIONS) failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluContextInfo.cpp"
               ,0xca);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(this_00,(long)numExtensions);
    lVar4 = 0;
    for (uVar5 = 0; (long)uVar5 < (long)numExtensions; uVar5 = uVar5 + 1) {
      (**(code **)(lVar6 + 0xa80))(0x1f03,uVar5 & 0xffffffff);
      std::__cxx11::string::assign
                ((char *)((long)&(((this_00->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar4));
      lVar4 = lVar4 + 0x20;
    }
    dVar3 = (**(code **)(lVar6 + 0x800))();
    checkError(dVar3,"glGetStringi(GL_EXTENSIONS, ndx) failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluContextInfo.cpp"
               ,0xcf);
  }
  return;
}

Assistant:

ContextInfo::ContextInfo (const RenderContext& context)
	: m_context(context)
{
	const glw::Functions& gl = context.getFunctions();

	if (context.getType().getAPI() == ApiType::es(2,0))
	{
		const char* result = (const char*)gl.getString(GL_EXTENSIONS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetString(GL_EXTENSIONS) failed");

		split(m_extensions, string(result));
	}
	else
	{
		int				numExtensions	= 0;

		gl.getIntegerv(GL_NUM_EXTENSIONS, &numExtensions);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_NUM_EXTENSIONS) failed");

		m_extensions.resize(numExtensions);
		for (int ndx = 0; ndx < numExtensions; ndx++)
			m_extensions[ndx] = (const char*)gl.getStringi(GL_EXTENSIONS, ndx);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetStringi(GL_EXTENSIONS, ndx) failed");
	}
}